

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall
ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(ON_SubD_FixedSizeHeap *this,ON_SubDFace *center_face0)

{
  ulong uVar1;
  ON_SubDVertex *this_00;
  ON_SubDFace *pOVar2;
  bool bVar3;
  bool bVar4;
  uint n;
  uint uVar5;
  ON_SubDEdge *pOVar6;
  bool local_79;
  ushort local_70;
  bool local_6d;
  uint local_6c;
  unsigned_short vfi;
  bool bEdgeIsHardCrease [2];
  uint fei;
  ON_SubDFace *vertex_face;
  ON_SubDVertex *vertex;
  ON_SubDEdge *edge;
  ON__UINT_PTR edge_ptr;
  ON_SubDEdgePtr *edges;
  uint uStack_38;
  bool bValenceTwoVertices;
  uint X;
  uint T;
  uint S;
  uint N;
  uint a_capacity;
  uint f_capacity;
  uint v_capacity;
  ON_SubDFace *center_face0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if ((center_face0 != (ON_SubDFace *)0x0) && (n = (uint)center_face0->m_edge_count, 2 < n)) {
    X = 0;
    uStack_38 = Internal_AtLeast4(n);
    edges._4_4_ = 0;
    edges._3_1_ = false;
    edge_ptr = (ON__UINT_PTR)center_face0->m_edge4;
    pOVar6 = ON_SubDFace::Edge(center_face0,n - 1);
    if (pOVar6 != (ON_SubDEdge *)0x0) {
      local_6d = ON_SubDEdge::IsHardCrease(pOVar6);
      local_6c = 0;
      while ((local_6c < n &&
             ((local_6c != 4 ||
              (edge_ptr = (ON__UINT_PTR)center_face0->m_edgex,
              (ON_SubDEdgePtr *)edge_ptr != (ON_SubDEdgePtr *)0x0))))) {
        uVar1 = *(ulong *)edge_ptr;
        pOVar6 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
        if (pOVar6 == (ON_SubDEdge *)0x0) break;
        bVar4 = ON_SubDEdge::IsHardCrease(pOVar6);
        this_00 = pOVar6->m_vertex[uVar1 & 1];
        if (((this_00 == (ON_SubDVertex *)0x0) || (this_00->m_edge_count < 2)) ||
           (this_00->m_edge_count < this_00->m_face_count)) break;
        X = this_00->m_edge_count + X;
        uVar5 = Internal_AtLeast4((uint)this_00->m_edge_count);
        edges._4_4_ = uVar5 + edges._4_4_;
        if (((local_6d == false) || (!bVar4)) ||
           (bVar3 = ON_SubDVertex::IsCreaseOrCorner(this_00), !bVar3)) {
          if (this_00->m_edge_count == 2) {
            edges._3_1_ = true;
          }
          for (local_70 = 0; local_70 < this_00->m_face_count; local_70 = local_70 + 1) {
            pOVar2 = this_00->m_faces[local_70];
            if ((pOVar2 != (ON_SubDFace *)0x0) && (center_face0 != pOVar2)) {
              uVar5 = Internal_AtLeast4((uint)pOVar2->m_edge_count);
              uStack_38 = uVar5 + uStack_38;
            }
          }
        }
        local_6c = local_6c + 1;
        edge_ptr = edge_ptr + 8;
        local_6d = bVar4;
      }
      if (local_6c == n) {
        uVar5 = ON_SubDComponentBase::SubdivisionLevel(&center_face0->super_ON_SubDComponentBase);
        local_79 = true;
        if (uVar5 != 0) {
          local_79 = edges._3_1_;
        }
        bVar4 = Internal_ReserveSubDWorkspace
                          (this,(ulong)((X - n) * 2 + 1),(ulong)X,
                           (ulong)((edges._4_4_ + uStack_38 + (X - n) * 4) * 2),local_79);
        return bVar4;
      }
    }
  }
  Destroy(this);
  if (center_face0 != (ON_SubDFace *)0x0) {
    ON_SubDIncrementErrorCount();
  }
  this_local._7_1_ = center_face0 == (ON_SubDFace *)0x0;
  return this_local._7_1_;
}

Assistant:

bool ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(
  const ON_SubDFace* center_face0
  )
{
  unsigned int v_capacity =  0;
  unsigned int f_capacity =  0;
  unsigned int a_capacity =  0;

  for (;;)
  {
    if (nullptr == center_face0)
      break;

    const unsigned int N = center_face0->m_edge_count;
    if (N <= 2)
      break;

    unsigned int S = 0;  // Set S = sum of the number of edges attached to each vertex of center_face0.
    unsigned int T = Internal_AtLeast4(N);  // Set T = capacity required for vertex edge arrays on face subdivision vertices
    unsigned int X = 0;
    bool bValenceTwoVertices = false; // bValenceTwoVertices = true if center_face0 has a valence 2 vertex and we need the hash table
    {
      const ON_SubDEdgePtr* edges = center_face0->m_edge4;
      ON__UINT_PTR edge_ptr;
      const ON_SubDEdge* edge;
      const ON_SubDVertex* vertex;
      const ON_SubDFace* vertex_face;
      unsigned int fei;
      edge = center_face0->Edge(N - 1);
      if (nullptr == edge)
        break;
      bool bEdgeIsHardCrease[2] = { false, edge->IsHardCrease() };
      for (fei = 0; fei < N; fei++, edges++)
      {
        if (4 == fei)
        {
          edges = center_face0->m_edgex;
          if (nullptr == edges)
            break;
        }
        edge_ptr = edges->m_ptr;
        edge = ON_SUBD_EDGE_POINTER(edge_ptr);
        if (nullptr == edge)
          break;
        bEdgeIsHardCrease[0] = bEdgeIsHardCrease[1];
        bEdgeIsHardCrease[1] = edge->IsHardCrease();
        vertex = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(edge_ptr)];
        if (nullptr == vertex)
          break;
        if (vertex->m_edge_count < 2)
          break;
        if (vertex->m_edge_count < vertex->m_face_count)
          break;
        S += vertex->m_edge_count;
        X += Internal_AtLeast4(vertex->m_edge_count);
        if ( bEdgeIsHardCrease[0] && bEdgeIsHardCrease[1] && vertex->IsCreaseOrCorner() )
        {
          // If this vertex has multiple sectors, the other sectors are isolated from center_face0 by hard creases.
          continue;
        }
        if (2 == vertex->m_edge_count)
        {
          // ring face has valence 2 vertex and the subdivision point for vertex_face
          // may be reference by 2 different edges from center_face0
          bValenceTwoVertices = true;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; ++vfi)
        {
          vertex_face = vertex->m_faces[vfi];
          if (nullptr == vertex_face || center_face0 == vertex_face)
            continue;
          T += Internal_AtLeast4(vertex_face->m_edge_count);
        }
      }
      if (fei != N)
        break;
    }

    // NOTE: S >= 2*N
    v_capacity =  2*(S - N) + 1; // maximum possible and occurs when all face0 edges are distinct and smooth
    f_capacity =  S;  // maximum possible and occurs when all face0 edges are distinct and smooth

    // T = capacity required for vertex edge arrays on face subdivision vertices
    // 4*(S-N) = capacity required for vertex edge arrays on edge subdivision vertices
    // X = capacity required for vertex edge arrays on vertex subdivision vertices
    //
    a_capacity = 2*( X + T + 4 * (S - N) ); // Twice the number of edges from all subdivision vertices.

    return Internal_ReserveSubDWorkspace(
      v_capacity,
      f_capacity,
      a_capacity,
      (0U == center_face0->SubdivisionLevel()) || bValenceTwoVertices
    );
  }

  Destroy();
  if (nullptr == center_face0 )
    return true;

  return ON_SUBD_RETURN_ERROR(false);
}